

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.h
# Opt level: O2

void __thiscall cbtBoxShape::getPlaneEquation(cbtBoxShape *this,cbtVector4 *plane,int i)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  cbtScalar cVar4;
  undefined1 auVar5 [16];
  
  if (5 < (uint)i) {
    return;
  }
  auVar3 = ZEXT416((uint)(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                         m_implicitShapeDimensions.m_floats[0]);
  cVar4 = 0.0;
  switch(i) {
  case 0:
    auVar5 = SUB6416(ZEXT464(0x3f800000),0);
    goto LAB_00df8d9c;
  case 1:
    auVar5 = SUB6416(ZEXT464(0xbf800000),0);
    goto LAB_00df8d9c;
  case 2:
    auVar5 = ZEXT816(0x3f80000000000000);
    break;
  case 3:
    auVar5 = ZEXT816(0xbf80000000000000);
    break;
  case 4:
    cVar4 = 1.0;
    goto LAB_00df8d94;
  case 5:
    cVar4 = -1.0;
LAB_00df8d94:
    auVar5 = ZEXT816(0) << 0x40;
    auVar3 = ZEXT416((uint)(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                           m_implicitShapeDimensions.m_floats[2]);
    goto LAB_00df8d9c;
  }
  auVar3 = ZEXT416((uint)(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                         m_implicitShapeDimensions.m_floats[1]);
LAB_00df8d9c:
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(auVar3,auVar2);
  uVar1 = vmovlps_avx(auVar5);
  *(undefined8 *)(plane->super_cbtVector3).m_floats = uVar1;
  (plane->super_cbtVector3).m_floats[2] = cVar4;
  (plane->super_cbtVector3).m_floats[3] = auVar3._0_4_;
  return;
}

Assistant:

virtual void getPlaneEquation(cbtVector4 & plane, int i) const
	{
		cbtVector3 halfExtents = getHalfExtentsWithoutMargin();

		switch (i)
		{
			case 0:
				plane.setValue(cbtScalar(1.), cbtScalar(0.), cbtScalar(0.), -halfExtents.x());
				break;
			case 1:
				plane.setValue(cbtScalar(-1.), cbtScalar(0.), cbtScalar(0.), -halfExtents.x());
				break;
			case 2:
				plane.setValue(cbtScalar(0.), cbtScalar(1.), cbtScalar(0.), -halfExtents.y());
				break;
			case 3:
				plane.setValue(cbtScalar(0.), cbtScalar(-1.), cbtScalar(0.), -halfExtents.y());
				break;
			case 4:
				plane.setValue(cbtScalar(0.), cbtScalar(0.), cbtScalar(1.), -halfExtents.z());
				break;
			case 5:
				plane.setValue(cbtScalar(0.), cbtScalar(0.), cbtScalar(-1.), -halfExtents.z());
				break;
			default:
				cbtAssert(0);
		}
	}